

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *b
                    )

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QString *pQVar3;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  char16_t *__dest;
  
  lVar5 = (a->d).size;
  pDVar2 = (a->d).d;
  lVar7 = (((b->a).a)->d).size + lVar5 + (b->a).b.d.size + (b->b).d.size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar5);
  }
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (pDVar2->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar5 < lVar7) {
    if (pDVar2 == (Data *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar5 < lVar7) {
      lVar5 = lVar7;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar5)) {
      lVar7 = (a->d).size;
      if (lVar5 < lVar7) {
        lVar5 = lVar7;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar5);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  __dest = (a->d).ptr + (a->d).size;
  pQVar3 = (b->a).a;
  lVar5 = (pQVar3->d).size;
  if (lVar5 != 0) {
    pcVar6 = (pQVar3->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar6,lVar5 * 2);
  }
  lVar7 = (b->a).b.d.size;
  if (lVar7 != 0) {
    pcVar6 = (b->a).b.d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar5,pcVar6,lVar7 * 2);
  }
  lVar4 = (b->b).d.size;
  if (lVar4 != 0) {
    pcVar6 = (b->b).d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar5 + lVar7,pcVar6,lVar4 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}